

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall
kj::Path::evalImpl(Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path)

{
  Vector<kj::String> *pVVar1;
  bool bVar2;
  char cVar3;
  unsigned_long *puVar4;
  Array<kj::String> local_b8;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  size_t local_70;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  size_t partStart;
  Vector<kj::String> *local_28;
  Vector<kj::String> *parts_local;
  StringPtr path_local;
  
  path_local.content.ptr = path.content.ptr;
  local_28 = (Vector<kj::String> *)this;
  parts_local = parts;
  path_local.content.size_ = (size_t)__return_storage_ptr__;
  StringPtr::StringPtr((StringPtr *)&partStart,"/");
  bVar2 = StringPtr::startsWith((StringPtr *)&parts_local,(StringPtr *)&partStart);
  if (bVar2) {
    Vector<kj::String>::clear(local_28);
  }
  __range1 = (Range<unsigned_long> *)0x0;
  ___begin1 = indices<kj::StringPtr&>((StringPtr *)&parts_local);
  __end1 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
  while (bVar2 = Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&i),
        pVVar1 = local_28, ((bVar2 ^ 0xffU) & 1) != 0) {
    puVar4 = Range<unsigned_long>::Iterator::operator*(&__end1);
    local_70 = *puVar4;
    cVar3 = StringPtr::operator[]((StringPtr *)&parts_local,local_70);
    pVVar1 = local_28;
    if (cVar3 == '/') {
      local_80 = StringPtr::slice((StringPtr *)&parts_local,(size_t)__range1,local_70);
      evalPart(pVVar1,local_80);
      __range1 = (Range<unsigned_long> *)(local_70 + 1);
    }
    Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  local_a0 = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)&parts_local,(size_t)__range1);
  local_90 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_a0);
  evalPart(pVVar1,local_90);
  Vector<kj::String>::releaseAsArray(&local_b8,local_28);
  Path(__return_storage_ptr__,&local_b8,ALREADY_CHECKED);
  Array<kj::String>::~Array(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

Path Path::evalImpl(Vector<String>&& parts, StringPtr path) {
  if (path.startsWith("/")) {
    parts.clear();
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '/') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}